

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  byte bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_348;
  undefined4 local_324;
  undefined1 local_320 [8];
  cmGeneratedFileStream fout;
  string filename;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  string name;
  cmMakefile *mf;
  cmExtraEclipseCDT4Generator *this_local;
  
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  if (!bVar1) {
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0x9d,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_00,0);
  name.field_2._8_8_ = cmLocalGenerator::GetMakefile(*ppcVar3);
  pcVar4 = cmMakefile::GetProjectName((cmMakefile *)name.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,pcVar4,&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"Source",&local_91);
  GetPathBasename((string *)((long)&filename.field_2 + 8),&this->HomeDirectory);
  GenerateProjectName((string *)local_38,&local_58,&local_90,(string *)((long)&filename.field_2 + 8)
                     );
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeDirectory,"/.project");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_320,pcVar4,false);
  bVar2 = std::ios::operator!((ios *)(local_320 + (long)*(_func_int **)((long)local_320 + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)local_320,
                             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>"
                            );
    EscapeForXML(&local_348,(string *)local_38);
    poVar5 = std::operator<<(poVar5,(string *)&local_348);
    std::operator<<(poVar5,
                    "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t</buildSpec>\n\t<natures>\n\t</natures>\n\t<linkedResources>\n"
                   );
    std::__cxx11::string::~string((string *)&local_348);
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmGeneratedFileStream *)local_320,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->SrcLinkedResources);
    }
    std::operator<<((ostream *)local_320,"\t</linkedResources>\n</projectDescription>\n");
    local_324 = 0;
  }
  else {
    local_324 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_320);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  const cmMakefile* mf
     = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  std::string name = this->GenerateProjectName(mf->GetProjectName(), "Source",
                                   this->GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" << this->EscapeForXML(name) << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t</buildSpec>\n"
    "\t<natures>\n"
    "\t</natures>\n"
    "\t<linkedResources>\n";

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeDirectory);
    this->SrcLinkedResources.clear();
    }

  fout <<
    "\t</linkedResources>\n"
    "</projectDescription>\n"
    ;
}